

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O0

MPP_RET avs2d_parse_prepare_split(Avs2dCtx_t *p_dec,MppPacket *pkt,HalDecTask *task)

{
  size_t sVar1;
  uint local_50;
  RK_U32 local_4c;
  uint local_48;
  RK_U32 remain;
  RK_U32 first_read_length;
  RK_U32 pkt_length;
  RK_U8 *p_end;
  RK_U8 *p_start;
  RK_U8 *p_curdata;
  HalDecTask *pHStack_20;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket *pkt_local;
  Avs2dCtx_t *p_dec_local;
  
  p_curdata._4_4_ = 0;
  p_start = (RK_U8 *)0x0;
  p_end = (RK_U8 *)0x0;
  _first_read_length = (RK_U8 *)0x0;
  remain = 0;
  local_48 = 0;
  pHStack_20 = task;
  task_local = (HalDecTask *)pkt;
  pkt_local = &p_dec->frame_slots;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","avs2d_parse_prepare_split");
  }
  sVar1 = mpp_packet_get_length(task_local);
  remain = (RK_U32)sVar1;
  p_end = (RK_U8 *)mpp_packet_get_pos(task_local);
  _first_read_length = p_end + ((ulong)remain - 1);
  if (remain < 4) {
    local_50 = remain;
  }
  else {
    local_50 = 4;
  }
  local_48 = local_50;
  p_start = p_end;
  memcpy((void *)((long)pkt_local + 0x1383),p_end,(ulong)local_50);
  local_4c = 0;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","previous data[0~3]=%02x %02x %02x, first_read_length %d\n",
               "avs2d_parse_prepare_split",(ulong)*(byte *)(pkt_local + 0x270),
               (ulong)*(byte *)((long)pkt_local + 0x1381),(uint)*(byte *)((long)pkt_local + 0x1382),
               local_48);
  }
  p_curdata._4_4_ =
       avs2_split_nalu((Avs2dCtx_t *)pkt_local,(RK_U8 *)(pkt_local + 0x270),7,3,&local_4c);
  p_start = p_end + ((ulong)local_48 - (ulong)local_4c);
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","remian length %d\n","avs2d_parse_prepare_split",(ulong)local_4c);
  }
  local_4c = 0;
  do {
    if ((_first_read_length <= p_start) ||
       (p_curdata._4_4_ =
             avs2_split_nalu((Avs2dCtx_t *)pkt_local,p_start,
                             ((int)_first_read_length - (int)p_start) + 1,0,&local_4c),
       p_curdata._4_4_ != MPP_OK)) goto LAB_001abed8;
    p_start = _first_read_length + (1 - (ulong)local_4c);
  } while ((*(int *)((long)pkt_local + 0x138c) == 0) &&
          ((*(uint *)(pkt_local + 0xf) < 2 ||
           (*(char *)((long)pkt_local[0xe] + (ulong)(*(int *)(pkt_local + 0xf) - 1) * 0x10 + 0xc) !=
            '\x01'))));
  pHStack_20->valid = 1;
LAB_001abed8:
  mpp_packet_set_pos(task_local,p_start);
  if ((local_4c == 0) && (memset(pkt_local + 0x270,0xff,3), 2 < remain)) {
    *(RK_U8 *)(pkt_local + 0x270) = *_first_read_length;
    *(RK_U8 *)((long)pkt_local + 0x1381) = _first_read_length[-1];
    *(RK_U8 *)((long)pkt_local + 0x1382) = _first_read_length[-2];
  }
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","Out.","avs2d_parse_prepare_split");
  }
  return p_curdata._4_4_;
}

Assistant:

MPP_RET avs2d_parse_prepare_split(Avs2dCtx_t *p_dec, MppPacket *pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *p_curdata = NULL;
    RK_U8 *p_start = NULL;
    RK_U8 *p_end = NULL;
    RK_U32 pkt_length = 0;
    RK_U32 first_read_length = 0;

    AVS2D_PARSE_TRACE("In.");

    pkt_length = (RK_U32) mpp_packet_get_length(pkt);

    p_curdata = p_start = (RK_U8 *) mpp_packet_get_pos(pkt);
    p_end = p_start + pkt_length - 1;

    // Combine last packet data
    first_read_length = (pkt_length >= 4) ? 4 : pkt_length;
    memcpy(p_dec->prev_tail_data + 3, p_curdata, first_read_length);

    RK_U32 remain = 0;

    AVS2D_PARSE_TRACE("previous data[0~3]=%02x %02x %02x, first_read_length %d\n",
                      p_dec->prev_tail_data[0], p_dec->prev_tail_data[1],
                      p_dec->prev_tail_data[2], first_read_length);
    ret = avs2_split_nalu(p_dec, p_dec->prev_tail_data,
                          AVS2D_PACKET_SPLIT_CHECKER_BUFFER_SIZE,
                          AVS2D_PACKET_SPLIT_LAST_KEPT_LENGTH,
                          &remain);
    p_curdata = p_start + first_read_length - remain;
    AVS2D_PARSE_TRACE("remian length %d\n", remain);

    remain = 0;

    while (p_curdata < p_end) {
        ret = avs2_split_nalu(p_dec, p_curdata, p_end - p_curdata + 1, 0, &remain);

        if (ret) {
            break;
        } else {
            p_curdata = p_end - remain + 1;
        }

        if (p_dec->new_frame_flag || (p_dec->nal_cnt > 1 && p_dec->p_nals[p_dec->nal_cnt - 1].eof == 1)) {
            task->valid = 1;
            break;
        }
    }

    mpp_packet_set_pos(pkt, p_curdata);

    if (remain == 0) {
        memset(p_dec->prev_tail_data, 0xff, 3);

        if (pkt_length >= 3) {
            p_dec->prev_tail_data[0] = p_end[0];
            p_dec->prev_tail_data[1] = p_end[-1];
            p_dec->prev_tail_data[2] = p_end[-2];
        }
    }

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}